

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O2

hrgls_Status hrgls_MessageSetValue(hrgls_Message obj,char *val)

{
  if (obj == (hrgls_Message)0x0) {
    return 0x3ee;
  }
  if (val != (char *)0x0) {
    std::__cxx11::string::assign((char *)obj);
    return 0;
  }
  return 0x3e9;
}

Assistant:

HRGLS_EXPORT hrgls_Status hrgls_MessageSetValue(hrgls_Message obj, const char *val)
  {
	  hrgls_Status s = hrgls_STATUS_OKAY;
	  if (!obj) {
		  return hrgls_STATUS_NULL_OBJECT_POINTER;
	  }
	  if (!val) {
		  return hrgls_STATUS_BAD_PARAMETER;
	  }
	  obj->value = val;
	  return s;
  }